

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GPUShaderFP64Test1::verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions
          (GPUShaderFP64Test1 *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar4;
  char *local_290;
  MessageBuilder local_288;
  _uniform_function local_108;
  uint local_104;
  int function;
  GLint uniform_location;
  uint n_uniform_location;
  uint n_nondouble_uniform_locations;
  GLint nondouble_uniform_locations [16];
  bool local_a9;
  bool result;
  Functions *gl;
  undefined1 local_98 [4];
  GLenum error_code;
  double double_data [16];
  GPUShaderFP64Test1 *this_local;
  long lVar3;
  
  memcpy(local_98,&DAT_029eebe0,0x80);
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  local_a9 = true;
  n_uniform_location = this->m_po_bool_uniform_location;
  n_nondouble_uniform_locations = this->m_po_bvec2_uniform_location;
  nondouble_uniform_locations[0] = this->m_po_bvec3_uniform_location;
  nondouble_uniform_locations[1] = this->m_po_bvec4_uniform_location;
  nondouble_uniform_locations[2] = this->m_po_float_uniform_location;
  nondouble_uniform_locations[3] = this->m_po_int_uniform_location;
  nondouble_uniform_locations[4] = this->m_po_ivec2_uniform_location;
  nondouble_uniform_locations[5] = this->m_po_ivec3_uniform_location;
  nondouble_uniform_locations[6] = this->m_po_ivec4_uniform_location;
  nondouble_uniform_locations[7] = this->m_po_uint_uniform_location;
  nondouble_uniform_locations[8] = this->m_po_uvec2_uniform_location;
  nondouble_uniform_locations[9] = this->m_po_uvec3_uniform_location;
  nondouble_uniform_locations[10] = this->m_po_uvec4_uniform_location;
  nondouble_uniform_locations[0xb] = this->m_po_vec2_uniform_location;
  nondouble_uniform_locations[0xc] = this->m_po_vec3_uniform_location;
  nondouble_uniform_locations[0xd] = this->m_po_vec4_uniform_location;
  uniform_location = 0x10;
  (**(code **)(lVar3 + 0x1680))(this->m_po_id);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xbf6);
  for (function = 0; (uint)function < 0x10; function = function + 1) {
    local_104 = (&n_uniform_location)[(uint)function];
    for (local_108 = UNIFORM_FUNCTION_1D; (int)local_108 < 0x11;
        local_108 = local_108 + UNIFORM_FUNCTION_1DV) {
      switch(local_108) {
      case UNIFORM_FUNCTION_1D:
        (**(code **)(lVar3 + 0x14d0))(0,local_104);
        break;
      case UNIFORM_FUNCTION_1DV:
        (**(code **)(lVar3 + 0x14d8))(local_104,1,local_98);
        break;
      case UNIFORM_FUNCTION_2D:
        (**(code **)(lVar3 + 0x1510))(0,0x3ff0000000000000,local_104);
        break;
      case UNIFORM_FUNCTION_2DV:
        (**(code **)(lVar3 + 0x1518))(local_104,1,local_98);
        break;
      case UNIFORM_FUNCTION_3D:
        (**(code **)(lVar3 + 0x1550))(0,0x3ff0000000000000,0x4000000000000000,local_104);
        break;
      case UNIFORM_FUNCTION_3DV:
        (**(code **)(lVar3 + 0x1558))(local_104,1,local_98);
        break;
      case UNIFORM_FUNCTION_4D:
        (**(code **)(lVar3 + 0x1590))
                  (0,0x3ff0000000000000,0x4000000000000000,0x4008000000000000,local_104);
        break;
      case UNIFORM_FUNCTION_4DV:
        (**(code **)(lVar3 + 0x1598))(local_104,1,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX2DV:
        (**(code **)(lVar3 + 0x15d8))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX2X3DV:
        (**(code **)(lVar3 + 0x15e8))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX2X4DV:
        (**(code **)(lVar3 + 0x15f8))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX3DV:
        (**(code **)(lVar3 + 0x1608))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX3X2DV:
        (**(code **)(lVar3 + 0x1618))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX3X4DV:
        (**(code **)(lVar3 + 0x1628))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX4DV:
        (**(code **)(lVar3 + 0x1638))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX4X2DV:
        (**(code **)(lVar3 + 0x1648))(local_104,1,0,local_98);
        break;
      case UNIFORM_FUNCTION_MATRIX4X3DV:
        (**(code **)(lVar3 + 0x1658))(local_104,1,0,local_98);
      }
      iVar1 = (**(code **)(lVar3 + 0x800))();
      if (iVar1 != 0x502) {
        this_00 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_288,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
        local_290 = getUniformFunctionString(this,local_108);
        pMVar4 = tcu::MessageBuilder::operator<<(&local_288,&local_290);
        pMVar4 = tcu::MessageBuilder::operator<<
                           (pMVar4,(char (*) [104])
                                   "() function did not generate GL_INVALID_OPERATION error when called for a uniform of incompatible type."
                           );
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_288);
        local_a9 = false;
      }
    }
  }
  return local_a9;
}

Assistant:

bool GPUShaderFP64Test1::verifyErrorGenerationWhenCallingTypeMismatchedUniformFunctions()
{
	const double		  double_data[] = { 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16 };
	glw::GLenum			  error_code	= GL_NO_ERROR;
	const glw::Functions& gl			= m_context.getRenderContext().getFunctions();
	bool				  result		= true;

	const glw::GLint nondouble_uniform_locations[] = { m_po_bool_uniform_location,  m_po_bvec2_uniform_location,
													   m_po_bvec3_uniform_location, m_po_bvec4_uniform_location,
													   m_po_float_uniform_location, m_po_int_uniform_location,
													   m_po_ivec2_uniform_location, m_po_ivec3_uniform_location,
													   m_po_ivec4_uniform_location, m_po_uint_uniform_location,
													   m_po_uvec2_uniform_location, m_po_uvec3_uniform_location,
													   m_po_uvec4_uniform_location, m_po_vec2_uniform_location,
													   m_po_vec3_uniform_location,  m_po_vec4_uniform_location };
	const unsigned int n_nondouble_uniform_locations =
		sizeof(nondouble_uniform_locations) / sizeof(nondouble_uniform_locations[0]);

	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	for (unsigned int n_uniform_location = 0; n_uniform_location < n_nondouble_uniform_locations; ++n_uniform_location)
	{
		glw::GLint uniform_location = nondouble_uniform_locations[n_uniform_location];

		for (int function = static_cast<int>(UNIFORM_FUNCTION_FIRST);
			 function < static_cast<int>(UNIFORM_FUNCTION_COUNT); ++function)
		{
			switch (static_cast<_uniform_function>(function))
			{
			case UNIFORM_FUNCTION_1D:
				gl.uniform1d(uniform_location, 0.0);
				break;
			case UNIFORM_FUNCTION_1DV:
				gl.uniform1dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_2D:
				gl.uniform2d(uniform_location, 0.0, 1.0);
				break;
			case UNIFORM_FUNCTION_2DV:
				gl.uniform2dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_3D:
				gl.uniform3d(uniform_location, 0.0, 1.0, 2.0);
				break;
			case UNIFORM_FUNCTION_3DV:
				gl.uniform3dv(uniform_location, 1, double_data);
				break;
			case UNIFORM_FUNCTION_4D:
				gl.uniform4d(uniform_location, 0.0, 1.0, 2.0, 3.0);
				break;
			case UNIFORM_FUNCTION_4DV:
				gl.uniform4dv(uniform_location, 1, double_data);
				break;

			case UNIFORM_FUNCTION_MATRIX2DV:
				gl.uniformMatrix2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X3DV:
				gl.uniformMatrix2x3dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX2X4DV:
				gl.uniformMatrix2x4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3DV:
				gl.uniformMatrix3dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X2DV:
				gl.uniformMatrix3x2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX3X4DV:
				gl.uniformMatrix3x4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4DV:
				gl.uniformMatrix4dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X2DV:
				gl.uniformMatrix4x2dv(uniform_location, 1, GL_FALSE, double_data);
				break;
			case UNIFORM_FUNCTION_MATRIX4X3DV:
				gl.uniformMatrix4x3dv(uniform_location, 1, GL_FALSE, double_data);
				break;

			default:
			{
				DE_ASSERT(false);
			}
			} /* switch (function) */

			error_code = gl.getError();
			if (error_code != GL_INVALID_OPERATION)
			{
				m_testCtx.getLog() << tcu::TestLog::Message
								   << getUniformFunctionString(static_cast<_uniform_function>(function))
								   << "() function did not generate GL_INVALID_OPERATION error when called for"
									  " a uniform of incompatible type."
								   << tcu::TestLog::EndMessage;

				result = false;
			}
		}
	} /* for (all checks) */

	return result;
}